

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowAnalysis.h
# Opt level: O1

bool __thiscall
slang::analysis::DataFlowAnalysis::isReferenced(DataFlowAnalysis *this,ValueSymbol *symbol)

{
  char *pcVar1;
  undefined4 uVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  value_type *elements;
  value_type *elements_1;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  auVar7._8_8_ = 0;
  auVar7._0_8_ = symbol;
  uVar10 = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar8 = uVar10 >> ((this->symbolToSlot).field_0x50 & 0x3f);
  lVar3 = *(long *)&(this->symbolToSlot).field_0x60;
  uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar10 & 0xff];
  uVar4 = *(ulong *)&(this->symbolToSlot).field_0x58;
  uVar11 = 0;
  do {
    pcVar1 = (char *)(lVar3 + uVar8 * 0x10);
    cVar13 = (char)uVar2;
    auVar17[0] = -(*pcVar1 == cVar13);
    cVar14 = (char)((uint)uVar2 >> 8);
    auVar17[1] = -(pcVar1[1] == cVar14);
    cVar15 = (char)((uint)uVar2 >> 0x10);
    auVar17[2] = -(pcVar1[2] == cVar15);
    cVar16 = (char)((uint)uVar2 >> 0x18);
    auVar17[3] = -(pcVar1[3] == cVar16);
    auVar17[4] = -(pcVar1[4] == cVar13);
    auVar17[5] = -(pcVar1[5] == cVar14);
    auVar17[6] = -(pcVar1[6] == cVar15);
    auVar17[7] = -(pcVar1[7] == cVar16);
    auVar17[8] = -(pcVar1[8] == cVar13);
    auVar17[9] = -(pcVar1[9] == cVar14);
    auVar17[10] = -(pcVar1[10] == cVar15);
    auVar17[0xb] = -(pcVar1[0xb] == cVar16);
    auVar17[0xc] = -(pcVar1[0xc] == cVar13);
    auVar17[0xd] = -(pcVar1[0xd] == cVar14);
    auVar17[0xe] = -(pcVar1[0xe] == cVar15);
    auVar17[0xf] = -(pcVar1[0xf] == cVar16);
    uVar12 = (uint)(ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe);
    if (uVar12 != 0) {
      lVar9 = *(long *)&(this->symbolToSlot).field_0x68 + uVar8 * 0xf0;
      do {
        iVar5 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> iVar5 & 1) == 0; iVar5 = iVar5 + 1) {
          }
        }
        if (*(ValueSymbol **)(lVar9 + (ulong)(uint)(iVar5 << 4)) == symbol) {
          if ((ulong)(uint)(iVar5 << 4) + lVar9 != 0) {
            return true;
          }
          goto LAB_00149b52;
        }
        uVar12 = uVar12 - 1 & uVar12;
      } while (uVar12 != 0);
    }
    if ((*(byte *)(uVar8 * 0x10 + lVar3 + 0xf) &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)uVar10 & 7]) == 0) break;
    lVar9 = uVar8 + uVar11;
    uVar11 = uVar11 + 1;
    uVar8 = lVar9 + 1U & uVar4;
  } while (uVar11 <= uVar4);
LAB_00149b52:
  uVar8 = uVar10 >> ((this->rvalues).field_0x130 & 0x3f);
  lVar3 = *(long *)&(this->rvalues).field_0x140;
  uVar4 = *(ulong *)&(this->rvalues).field_0x138;
  uVar11 = 0;
  do {
    pcVar1 = (char *)(lVar3 + uVar8 * 0x10);
    auVar18[0] = -(*pcVar1 == cVar13);
    auVar18[1] = -(pcVar1[1] == cVar14);
    auVar18[2] = -(pcVar1[2] == cVar15);
    auVar18[3] = -(pcVar1[3] == cVar16);
    auVar18[4] = -(pcVar1[4] == cVar13);
    auVar18[5] = -(pcVar1[5] == cVar14);
    auVar18[6] = -(pcVar1[6] == cVar15);
    auVar18[7] = -(pcVar1[7] == cVar16);
    auVar18[8] = -(pcVar1[8] == cVar13);
    auVar18[9] = -(pcVar1[9] == cVar14);
    auVar18[10] = -(pcVar1[10] == cVar15);
    auVar18[0xb] = -(pcVar1[0xb] == cVar16);
    auVar18[0xc] = -(pcVar1[0xc] == cVar13);
    auVar18[0xd] = -(pcVar1[0xd] == cVar14);
    auVar18[0xe] = -(pcVar1[0xe] == cVar15);
    auVar18[0xf] = -(pcVar1[0xf] == cVar16);
    uVar12 = (uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe);
    if (uVar12 != 0) {
      lVar9 = *(long *)&(this->rvalues).field_0x148 + uVar8 * 0x438;
      do {
        uVar6 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
          }
        }
        if (*(ValueSymbol **)(lVar9 + (ulong)uVar6 * 0x48) == symbol) {
          return (ulong)uVar6 * 0x48 + lVar9 != 0;
        }
        uVar12 = uVar12 - 1 & uVar12;
      } while (uVar12 != 0);
    }
    if ((*(byte *)(uVar8 * 0x10 + lVar3 + 0xf) &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)uVar10 & 7]) == 0) {
      return false;
    }
    lVar9 = uVar8 + uVar11;
    uVar11 = uVar11 + 1;
    uVar8 = lVar9 + 1U & uVar4;
  } while (uVar11 <= uVar4);
  return false;
}

Assistant:

bool isReferenced(const ValueSymbol& symbol) const {
        return symbolToSlot.contains(&symbol) || rvalues.contains(&symbol);
    }